

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O2

void __thiscall
google::protobuf::io::Printer::Printer
          (Printer *this,ZeroCopyOutputStream *output,char variable_delimiter,
          AnnotationCollector *annotation_collector)

{
  Options options;
  Options local_58;
  
  Options::Options(&local_58,variable_delimiter,annotation_collector);
  options.annotation_collector = local_58.annotation_collector;
  options.variable_delimiter = local_58.variable_delimiter;
  options._1_7_ = local_58._1_7_;
  options.comment_start._M_len = local_58.comment_start._M_len;
  options.comment_start._M_str = local_58.comment_start._M_str;
  options.ignored_comment_start._M_len = local_58.ignored_comment_start._M_len;
  options.ignored_comment_start._M_str = local_58.ignored_comment_start._M_str;
  options.spaces_per_indent = local_58.spaces_per_indent;
  options.enable_codegen_trace.super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> =
       local_58.enable_codegen_trace.super__Optional_base<bool,_true,_true>._M_payload.
       super__Optional_payload_base<bool>;
  options._58_6_ = local_58._58_6_;
  Printer(this,output,options);
  return;
}

Assistant:

Printer::Printer(ZeroCopyOutputStream* output, char variable_delimiter,
                 AnnotationCollector* annotation_collector)
    : Printer(output, Options{variable_delimiter, annotation_collector}) {}